

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O1

void Ssc_ManStop(Ssc_Man_t *p)

{
  int *piVar1;
  
  if (p->vFront != (Vec_Int_t *)0x0) {
    piVar1 = p->vFront->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vFront->pArray = (int *)0x0;
    }
    if (p->vFront != (Vec_Int_t *)0x0) {
      free(p->vFront);
      p->vFront = (Vec_Int_t *)0x0;
    }
  }
  if (p->vFanins != (Vec_Int_t *)0x0) {
    piVar1 = p->vFanins->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vFanins->pArray = (int *)0x0;
    }
    if (p->vFanins != (Vec_Int_t *)0x0) {
      free(p->vFanins);
      p->vFanins = (Vec_Int_t *)0x0;
    }
  }
  if (p->vPattern != (Vec_Int_t *)0x0) {
    piVar1 = p->vPattern->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vPattern->pArray = (int *)0x0;
    }
    if (p->vPattern != (Vec_Int_t *)0x0) {
      free(p->vPattern);
      p->vPattern = (Vec_Int_t *)0x0;
    }
  }
  if (p->vDisPairs != (Vec_Int_t *)0x0) {
    piVar1 = p->vDisPairs->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vDisPairs->pArray = (int *)0x0;
    }
    if (p->vDisPairs != (Vec_Int_t *)0x0) {
      free(p->vDisPairs);
      p->vDisPairs = (Vec_Int_t *)0x0;
    }
  }
  if (p->vPivot != (Vec_Int_t *)0x0) {
    piVar1 = p->vPivot->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vPivot->pArray = (int *)0x0;
    }
    if (p->vPivot != (Vec_Int_t *)0x0) {
      free(p->vPivot);
      p->vPivot = (Vec_Int_t *)0x0;
    }
  }
  if (p->vId2Var != (Vec_Int_t *)0x0) {
    piVar1 = p->vId2Var->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vId2Var->pArray = (int *)0x0;
    }
    if (p->vId2Var != (Vec_Int_t *)0x0) {
      free(p->vId2Var);
      p->vId2Var = (Vec_Int_t *)0x0;
    }
  }
  if (p->vVar2Id != (Vec_Int_t *)0x0) {
    piVar1 = p->vVar2Id->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vVar2Id->pArray = (int *)0x0;
    }
    if (p->vVar2Id != (Vec_Int_t *)0x0) {
      free(p->vVar2Id);
      p->vVar2Id = (Vec_Int_t *)0x0;
    }
  }
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  Gia_ManStopP(&p->pFraig);
  if (p != (Ssc_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Ssc_ManStop( Ssc_Man_t * p )
{
    Vec_IntFreeP( &p->vFront );
    Vec_IntFreeP( &p->vFanins );
    Vec_IntFreeP( &p->vPattern );
    Vec_IntFreeP( &p->vDisPairs );
    Vec_IntFreeP( &p->vPivot );
    Vec_IntFreeP( &p->vId2Var );
    Vec_IntFreeP( &p->vVar2Id );
    if ( p->pSat ) sat_solver_delete( p->pSat );
    Gia_ManStopP( &p->pFraig );
    ABC_FREE( p );
}